

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec-group.c
# Opt level: O2

void fec_group_print(fec_group_t *group)

{
  char *__format;
  ulong uVar1;
  
  if (group != (fec_group_t *)0x0) {
    fprintf(_stderr,"Group %p tstamp: %lu\n",group,group->tstamp);
    fprintf(_stderr,"k: %d, n: %d, len: %u\n",(ulong)group->fec_k,(ulong)group->fec_n,
            (ulong)group->fec_len);
    fprintf(_stderr,"received packets: %u/%u\n",(ulong)group->rcvd_pkts,(ulong)group->fec_k);
    for (uVar1 = 0; uVar1 < group->fec_n; uVar1 = uVar1 + 1) {
      __format = "%d: received\n";
      if (group->lengths[uVar1] == 0) {
        __format = "%d: not received\n";
      }
      fprintf(_stderr,__format,uVar1 & 0xffffffff);
    }
    return;
  }
  __assert_fail("group != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",0x53,
                "void fec_group_print(fec_group_t *)");
}

Assistant:

void fec_group_print(fec_group_t *group) {
  assert(group != NULL);
  
  fprintf(stderr, "Group %p tstamp: %lu\n", group, group->tstamp);
  fprintf(stderr, "k: %d, n: %d, len: %u\n",
          group->fec_k, group->fec_n, group->fec_len);
  
  fprintf(stderr, "received packets: %u/%u\n",
          group->rcvd_pkts, group->fec_k);

  int i;
  for (i = 0; i < group->fec_n; i++) {
    if (group->lengths[i] == 0) {
      fprintf(stderr, "%d: not received\n", i);
    } else {
      fprintf(stderr, "%d: received\n", i);
    }
  }
}